

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bufferedReaderManager.cpp
# Opt level: O2

void __thiscall
BufferedReaderManager::BufferedReaderManager
          (BufferedReaderManager *this,uint32_t readersCnt,uint32_t blockSize,uint32_t allocSize,
          uint32_t prereadThreshold)

{
  value_type this_00;
  uint32_t uVar1;
  BufferedReader *reader;
  value_type local_38;
  
  (this->m_fileReaders).super__Vector_base<BufferedReader_*,_std::allocator<BufferedReader_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_fileReaders).super__Vector_base<BufferedReader_*,_std::allocator<BufferedReader_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_fileReaders).super__Vector_base<BufferedReader_*,_std::allocator<BufferedReader_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  init(this,(EVP_PKEY_CTX *)(ulong)blockSize);
  for (uVar1 = 0; readersCnt != uVar1; uVar1 = uVar1 + 1) {
    this_00 = (value_type)operator_new(0x1d8);
    BufferedFileReader::BufferedFileReader
              ((BufferedFileReader *)this_00,blockSize,allocSize,prereadThreshold);
    this_00->m_id = uVar1;
    local_38 = this_00;
    std::vector<BufferedReader_*,_std::allocator<BufferedReader_*>_>::push_back
              (&this->m_fileReaders,&local_38);
  }
  this->m_readersCnt = readersCnt;
  return;
}

Assistant:

BufferedReaderManager::BufferedReaderManager(const uint32_t readersCnt, const uint32_t blockSize,
                                             const uint32_t allocSize, const uint32_t prereadThreshold)
{
    init(blockSize, allocSize, prereadThreshold);

    for (uint32_t i = 0; i < readersCnt; i++)
    {
        BufferedReader* reader = new BufferedFileReader(blockSize, allocSize, prereadThreshold);
        reader->setId(i);
        m_fileReaders.push_back(reader);
    }

    m_readersCnt = readersCnt;
}